

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAPropBag.cpp
# Opt level: O3

HRESULT __thiscall Js::SCAPropBag::Get(SCAPropBag *this,LPCWSTR name,Var *pValue)

{
  ScriptContext *scriptContext;
  uint uVar1;
  size_t sVar2;
  BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  HRESULT HVar3;
  void *unaff_retaddr;
  undefined1 auStack_98 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  
  scriptContext = (this->super_ScriptContextHolder).m_scriptContext;
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_98 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
             (ScriptEntryExitRecord *)auStack_98,unaff_retaddr,&stack0x00000000,false,false,false);
  ScriptContext::OnScriptStart(scriptContext,false,true);
  EnterScriptObject::VerifyEnterScript((EnterScriptObject *)&__entryExitRecord.handledExceptionType)
  ;
  sVar2 = PAL_wcslen(name);
  if ((int)(charcount_t)sVar2 < 0) {
    HVar3 = -0x7ff8fdea;
  }
  else {
    this_00 = Memory::
              RecyclerRootPtr<JsUtil::BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>_>
              ::operator->(&this->m_properties);
    InternalString::InternalString
              ((InternalString *)&__enterScriptObject.library,name,(charcount_t)sVar2,'\0');
    uVar1 = JsUtil::
            BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
            ::FindEntryWithKey<Js::InternalString>
                      (this_00,(InternalString *)&__enterScriptObject.library);
    if ((int)uVar1 < 0) {
      HVar3 = -0x7fffbffb;
    }
    else {
      *pValue = (this_00->entries).ptr[uVar1].
                super_CacheHashedEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_>.
                super_ValueEntry<Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_Memory::WriteBarrierPtr<void>_>_>
                .super_KeyValueEntryDataLayout2<Js::InternalString,_Memory::WriteBarrierPtr<void>_>.
                value.ptr;
      HVar3 = 0;
    }
  }
  EnterScriptObject::~EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  return HVar3;
}

Assistant:

HRESULT SCAPropBag::Get(LPCWSTR name, Var* pValue)
    {
        HRESULT hr = S_OK;
        ScriptContext* scriptContext = GetScriptContext();

        BEGIN_JS_RUNTIME_CALL_EX(scriptContext, false)
        {
            int len;
            IfFailGo(SizeTToInt(wcslen(name), &len));

            if (!m_properties->TryGetValue(InternalString(name, len), pValue))
            {
                hr = E_FAIL;
            }
        }
        END_JS_RUNTIME_CALL(scriptContext);
Error:
        return hr;
    }